

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntrusiveList.h
# Opt level: O0

void __thiscall
IntrusiveList<SynConstantSet>::push_back(IntrusiveList<SynConstantSet> *this,SynConstantSet *node)

{
  SynConstantSet *node_local;
  IntrusiveList<SynConstantSet> *this_local;
  
  if (node == (SynConstantSet *)0x0) {
    __assert_fail("node",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/IntrusiveList.h"
                  ,0xf,"void IntrusiveList<SynConstantSet>::push_back(T *) [T = SynConstantSet]");
  }
  if ((node->super_SynBase).next == (SynBase *)0x0) {
    if ((((node->super_SynBase).listed ^ 0xffU) & 1) == 0) {
      __assert_fail("!node->listed",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/IntrusiveList.h"
                    ,0x11,"void IntrusiveList<SynConstantSet>::push_back(T *) [T = SynConstantSet]")
      ;
    }
    (node->super_SynBase).listed = true;
    if (this->head == (SynConstantSet *)0x0) {
      this->tail = node;
      this->head = node;
    }
    else {
      (this->tail->super_SynBase).next = &node->super_SynBase;
      this->tail = node;
    }
    return;
  }
  __assert_fail("node->next == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/IntrusiveList.h"
                ,0x10,"void IntrusiveList<SynConstantSet>::push_back(T *) [T = SynConstantSet]");
}

Assistant:

void push_back(T *node)
	{
		assert(node);
		assert(node->next == 0);
		assert(!node->listed);

		node->listed = true;

		if(!head)
		{
			head = tail = node;
		}
		else
		{
			tail->next = node;
			tail = node;
		}
	}